

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[3],kj::StringTree,char_const(&)[12],kj::StringTree,char_const(&)[11],kj::StringTree,char_const(&)[24],kj::StringTree,char_const(&)[27]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],StringTree *params_1,
          char (*params_2) [12],StringTree *params_3,char (*params_4) [11],StringTree *params_5,
          char (*params_6) [24],StringTree *params_7,char (*params_8) [27])

{
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_40 = toCharSequence<char_const(&)[3]>((char (*) [3])this);
  local_50 = toCharSequence<char_const(&)[12]>((char (*) [12])params_1);
  local_60 = toCharSequence<char_const(&)[11]>((char (*) [11])params_3);
  local_70 = toCharSequence<char_const(&)[24]>((char (*) [24])params_5);
  local_80 = toCharSequence<char_const(&)[27]>((char (*) [27])params_7);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,(ArrayPtr<const_char> *)params,
             (StringTree *)&local_50,(ArrayPtr<const_char> *)params_2,(StringTree *)&local_60,
             (ArrayPtr<const_char> *)params_4,(StringTree *)&local_70,
             (ArrayPtr<const_char> *)params_6,(StringTree *)&local_80,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}